

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O2

void __thiscall egc::Sequencer::TS(Sequencer *this,unsigned_short instruction)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  ostream *poVar3;
  Memory *pMVar4;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"TS");
  poVar3 = std::operator<<(poVar3," ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 0x40;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,instruction & 0x3ff);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar3);
  pMVar4 = (this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((instruction & 0x3ff) == 0) {
    uVar2 = Memory::GetAccumulatorOverflow(pMVar4);
    if (uVar2 == 0) {
      return;
    }
  }
  else {
    uVar1 = Memory::Read(pMVar4,0,0);
    uVar2 = Memory::GetAccumulatorOverflow
                      ((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,instruction & 0x3ff,uVar1);
    pMVar4 = (this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (uVar2 == 0) {
      uVar2 = 0;
      goto LAB_001055ac;
    }
    Memory::Write(pMVar4,0,uVar2);
  }
  pMVar4 = (this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar2 = 5;
  uVar1 = Memory::Read(pMVar4,5,0);
  uVar1 = uVar1 + 1;
LAB_001055ac:
  Memory::Write(pMVar4,uVar2,uVar1);
  return;
}

Assistant:

void egc::Sequencer::TS (unsigned short instruction)
{
    unsigned short k = instruction & 001777u;

    std::cout << "TS" << " " << std::oct << k << std::dec << std::endl;

    if (k == 000000u) // OVSK
    {
        auto overflow = m_Memory->GetAccumulatorOverflow();

        if (overflow)
        {
            m_Memory->Write(00005u, m_Memory->Read(00005u) + 000001u);
        }
    }
    else
    {
        auto a = m_Memory->Read(00000u);

        auto overflow = m_Memory->GetAccumulatorOverflow();

        m_Memory->Write(k, a);

        if (overflow)
        {
            m_Memory->Write(00000u, overflow);
            m_Memory->Write(00005u, m_Memory->Read(00005u) + 000001u);
        }
        else
        {
            m_Memory->Write(00000u, a);
        }
    }
}